

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

string * __thiscall Tracker::logAverage(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  iterator iVar1;
  long lVar2;
  _Base_ptr p_Var3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double average;
  double local_190;
  double local_188;
  string track_name;
  string local_160;
  double local_140;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
          ::find(&(this->m_data)._M_t,_track);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&track_name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&track_name);
    std::__cxx11::string::string((string *)&track_name,(string *)(iVar1._M_node + 1));
    p_Var3 = iVar1._M_node[3]._M_parent;
    lVar2 = ((long)iVar1._M_node[3]._M_left - (long)p_Var3) / 0x18;
    local_190 = 0.0;
    dVar5 = 0.0;
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      dVar5 = dVar5 + (double)p_Var3->_M_left;
      if (lVar4 != 0) {
        local_190 = local_190 + (*(double *)p_Var3 - (double)p_Var3[-1]._M_parent);
      }
      p_Var3 = (_Base_ptr)&p_Var3->_M_right;
    }
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
    average = dVar5 / dVar7;
    local_190 = local_190 / (dVar7 + -1.0);
    *(double *)(iVar1._M_node + 4) = average;
    local_188 = local_190;
    std::operator+(&local_f8,&track_name,",");
    vera::toString<double>(&local_118,&average);
    std::operator+(&local_d8,&local_f8,&local_118);
    std::operator+(&local_b8,&local_d8,",");
    local_140 = (average / local_188) * 100.0;
    vera::toString<double>(&local_138,&local_140);
    std::operator+(&local_98,&local_b8,&local_138);
    std::operator+(&local_78,&local_98,",");
    vera::toString<double>(&local_160,&local_190);
    std::operator+(&local_58,&local_78,&local_160);
    std::operator+(&local_38,&local_58,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&track_name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logAverage(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;

    double average = 0.0;
    double delta = 0.0;
    for (size_t i = 0; i < it->second.samples.size(); i++) {
        average += it->second.samples[i].durationMs;
        if (i > 0)
            delta += it->second.samples[i].startMs - it->second.samples[i-1].startMs;
    }

    average /= (double)it->second.samples.size();
    delta /= (double)it->second.samples.size() - 1.0;
    it->second.durationAverage = average;
    
    log += track_name + "," + vera::toString(average) + "," + vera::toString( (average/delta) * 100.0) + "," + vera::toString(delta) +  "\n";

    return log;
}